

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O2

BOOL pattern_range(char *pattern,int which,PatternRange *range)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  char *p;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  
  iVar3 = (int)pattern;
  do {
    if (*pattern == '\0') {
      return FALSE;
    }
    pcVar4 = pattern + -1;
    pcVar5 = pcVar4;
    do {
      pbVar1 = (byte *)(pcVar4 + 1);
      pcVar4 = pcVar4 + 1;
      pcVar5 = pcVar5 + 1;
    } while ((*pbVar1 & 0xfe) == 0x30);
    range->index = (int)pcVar5 - iVar3;
    for (lVar6 = 0; (pcVar4[lVar6] != '\0' && (pcVar4[lVar6] == *pcVar4)); lVar6 = lVar6 + 1) {
    }
    range->length = (int)lVar6;
    pattern = pcVar4 + lVar6;
    bVar2 = 1 < which;
    which = which + -1;
  } while (bVar2);
  return TRUE;
}

Assistant:

BOOL
pattern_range (const char *pattern, int which, PatternRange *range)
{
  const char *p = pattern, *p2;

  do
    {
      if (*p == '\0')
	return FALSE;

      /* Skip to first sequence. */
      for (; *p != '\0' && (*p == '0' || *p == '1'); p++)
	;

      /* Remember where the pattern started. */
      range->index = p - pattern;
      p2 = p;

      /* Find the end of the sequence. */
      for (; *p != '\0' && *p == *p2; p++)
	;

      /* Remember the length of the pattern. */
      range->length = p - p2;
    }
  while (--which > 0);

  return TRUE;
}